

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O1

void __thiscall
defyx::VmBase<defyx::AlignedAllocator<64UL>,_false>::~VmBase
          (VmBase<defyx::AlignedAllocator<64UL>,_false> *this)

{
  pointer pcVar1;
  
  (this->super_defyx_vm)._vptr_defyx_vm = (_func_int **)&PTR__VmBase_00130c30;
  AlignedAllocator<64UL>::freeMemory((this->super_defyx_vm).scratchpad,0x40000);
  (this->super_defyx_vm)._vptr_defyx_vm = (_func_int **)&PTR___cxa_pure_virtual_00130528;
  pcVar1 = (this->super_defyx_vm).cacheKey._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_defyx_vm).cacheKey.field_2) {
    ::operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

VmBase<Allocator, softAes>::~VmBase() {
		Allocator::freeMemory(scratchpad, ScratchpadSize);
	}